

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O2

void __thiscall
ft::deque<int,_ft::allocator<int>_>::deque
          (deque<int,_ft::allocator<int>_> *this,deque<int,_ft::allocator<int>_> *other)

{
  constDequeIterator<int,_64UL> local_78;
  constDequeIterator<int,_64UL> local_50;
  
  (this->m_start)._vptr_dequeIterator = (_func_int **)&PTR__dequeIterator_0010bce8;
  (this->m_finish)._vptr_dequeIterator = (_func_int **)&PTR__dequeIterator_0010bce8;
  this->m_map = (map_pointer)0x0;
  this->m_map_size = 0;
  this->m_chunks = 0;
  this->m_size = 0;
  dequeInit(this,other->m_size);
  constDequeIterator<int,_64UL>::constDequeIterator(&local_78,&other->m_start);
  constDequeIterator<int,_64UL>::constDequeIterator(&local_50,&other->m_finish);
  deque<int,ft::allocator<int>>::assign<ft::constDequeIterator<int,64ul>>
            ((deque<int,ft::allocator<int>> *)this,&local_78,&local_50,(type *)0x0);
  return;
}

Assistant:

deque(deque const & other):
		m_map(NULL),
		m_map_size(0),
		m_chunks(0),
		m_size(0),
		m_alloc(other.get_allocator()) {
		this->dequeInit(other.size());
		this->assign(other.begin(), other.end());
	}